

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

QVariant * __thiscall QSQLiteResult::lastInsertId(QSQLiteResult *this)

{
  ulong uVar1;
  QSQLiteDriverPrivate *pQVar2;
  sqlite3_int64 sVar3;
  QSQLiteResultPrivate *in_RDI;
  qint64 id;
  QSQLiteResultPrivate *d;
  QSQLiteResultPrivate *this_00;
  
  this_00 = in_RDI;
  d_func((QSQLiteResult *)0x116e0d);
  uVar1 = QSqlResult::isActive();
  if ((uVar1 & 1) != 0) {
    pQVar2 = QSQLiteResultPrivate::drv_d_func(this_00);
    sVar3 = sqlite3_last_insert_rowid(pQVar2->access);
    if (sVar3 != 0) {
      QVariant::QVariant((QVariant *)in_RDI,sVar3);
      return (QVariant *)this_00;
    }
  }
  QVariant::QVariant((QVariant *)0x116e60);
  return (QVariant *)this_00;
}

Assistant:

QVariant QSQLiteResult::lastInsertId() const
{
    Q_D(const QSQLiteResult);
    if (isActive()) {
        qint64 id = sqlite3_last_insert_rowid(d->drv_d_func()->access);
        if (id)
            return id;
    }
    return QVariant();
}